

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
* __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
::operator=(linked_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
            *this,linked_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                  *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<std::__cxx11::string_const&>const>::
    copy<testing::MatcherInterface<std::__cxx11::string_const&>const>
              ((linked_ptr<testing::MatcherInterface<std::__cxx11::string_const&>const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }